

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

GenerateBlockSymbol *
slang::ast::GenerateBlockSymbol::fromSyntax
          (Scope *scope,GenerateBlockSyntax *syntax,uint32_t constructIndex)

{
  GenerateBlockSymbol *this;
  iterator ppMVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  bool local_59;
  GenerateBlockSymbol *local_58;
  GenerateBlockSymbol *block;
  Compilation *comp;
  SourceLocation local_38;
  SourceLocation loc;
  string_view name;
  uint32_t constructIndex_local;
  GenerateBlockSyntax *syntax_local;
  Scope *scope_local;
  
  name._M_str._4_4_ = constructIndex;
  _loc = getGenerateBlockName((SyntaxNode *)syntax);
  _comp = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_38 = parsing::Token::location((Token *)&comp);
  block = (GenerateBlockSymbol *)Scope::getCompilation(scope);
  local_59 = true;
  local_58 = BumpAllocator::
             emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&,bool>
                       ((BumpAllocator *)block,(Compilation *)block,
                        (basic_string_view<char,_std::char_traits<char>_> *)&loc,&local_38,
                        (uint *)((long)&name._M_str + 4),&local_59);
  Symbol::setSyntax(&local_58->super_Symbol,(SyntaxNode *)syntax);
  this = local_58;
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (&(syntax->members).
                       super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  ppMVar1 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      (&(syntax->members).
                        super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppMVar1; __end2 = __end2 + 1) {
    Scope::addMembers(&local_58->super_Scope,&(*__end2)->super_SyntaxNode);
  }
  return local_58;
}

Assistant:

GenerateBlockSymbol& GenerateBlockSymbol::fromSyntax(const Scope& scope,
                                                     const GenerateBlockSyntax& syntax,
                                                     uint32_t constructIndex) {
    // This overload is only called for the illegal case of a generate block
    // without a condition attached.
    string_view name = getGenerateBlockName(syntax);
    SourceLocation loc = syntax.getFirstToken().location();

    auto& comp = scope.getCompilation();
    auto block = comp.emplace<GenerateBlockSymbol>(comp, name, loc, constructIndex,
                                                   /* isInstantiated */ true);
    block->setSyntax(syntax);
    block->setAttributes(scope, syntax.attributes);

    for (auto member : syntax.members)
        block->addMembers(*member);

    return *block;
}